

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.h
# Opt level: O0

void __thiscall
GlobalBailOutRecordDataTable::
IterateGlobalBailOutRecordTableRows<BailOutRecord::AdjustOffsetsForDiagMode(Js::JavascriptCallStackLayout*,Js::ScriptFunction*)const::__0>
          (GlobalBailOutRecordDataTable *this,uint32 bailOutRecordId,
          anon_class_16_2_53d04e8b callback)

{
  uint local_28;
  uint i;
  uint32 bailOutRecordId_local;
  GlobalBailOutRecordDataTable *this_local;
  anon_class_16_2_53d04e8b callback_local;
  
  callback_local.functionBody = (FunctionBody *)callback.entryPointInfo;
  this_local = (GlobalBailOutRecordDataTable *)callback.functionBody;
  local_28 = 0;
  do {
    if (this->length <= local_28) {
      return;
    }
    if (bailOutRecordId <= this->globalBailOutRecordDataRows[local_28].end) {
      if (bailOutRecordId < this->globalBailOutRecordDataRows[local_28].start) {
        return;
      }
      BailOutRecord::AdjustOffsetsForDiagMode::anon_class_16_2_53d04e8b::operator()
                ((anon_class_16_2_53d04e8b *)&this_local,
                 this->globalBailOutRecordDataRows + local_28);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void IterateGlobalBailOutRecordTableRows(uint32 bailOutRecordId, Fn callback)
    {
        // Visit all the rows that have this bailout ID in their range.
        for (uint i = 0; i < this->length; i++)
        {
            if (bailOutRecordId > globalBailOutRecordDataRows[i].end)
            {
                // Not in range.
                continue;
            }

            if (globalBailOutRecordDataRows[i].start > bailOutRecordId)
            {
                // Not in range, and we know there are no more in range (since the table is sorted by "start").
                return;
            }

            // In range: take action.
            callback(&globalBailOutRecordDataRows[i]);
        }
    }